

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

Expression * __thiscall rsg::ParenOp::createNextChild(ParenOp *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  Scalar *pSVar1;
  Expression *pEVar2;
  Scalar *pSVar3;
  
  if (this->m_child != (Expression *)0x0) {
    return (Expression *)0x0;
  }
  pSVar1 = (this->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (this->m_valueRange).m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 == (this->m_valueRange).m_min.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar1 = (Scalar *)0x0;
  }
  if (pSVar3 == (this->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar3 = (Scalar *)0x0;
  }
  valueRange.m_min = pSVar1;
  valueRange.m_type = &(this->m_valueRange).m_type;
  valueRange.m_max = pSVar3;
  pEVar2 = Expression::createRandom(state,valueRange);
  this->m_child = pEVar2;
  return pEVar2;
}

Assistant:

Expression* ParenOp::createNextChild (GeneratorState& state)
{
	if (m_child == DE_NULL)
	{
		m_child = Expression::createRandom(state, m_valueRange.asAccess());
		return m_child;
	}
	else
		return DE_NULL;
}